

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ipaddr.c
# Opt level: O1

int main(void)

{
  lrtr_ip_addr a;
  lrtr_ip_addr a_00;
  lrtr_ip_addr a_01;
  lrtr_ip_addr a_02;
  lrtr_ip_addr b;
  lrtr_ip_addr b_00;
  lrtr_ip_addr b_01;
  lrtr_ip_addr b_02;
  _Bool _Var1;
  int iVar2;
  long in_FS_OFFSET;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  lrtr_ip_addr addr;
  char buf [16];
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff74;
  undefined1 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff79;
  undefined1 in_stack_ffffffffffffff7a;
  undefined1 in_stack_ffffffffffffff7b;
  anon_union_16_2_f3fa3043_for_u aStack_84;
  char cStack_74;
  char cStack_73;
  char cStack_72;
  char cStack_71;
  char cStack_70;
  lrtr_ip_addr local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lrtr_ip_str_to_addr("0.0.0.0",(lrtr_ip_addr *)&stack0xffffffffffffff78);
  if (CONCAT13(in_stack_ffffffffffffff7b,
               CONCAT12(in_stack_ffffffffffffff7a,
                        CONCAT11(in_stack_ffffffffffffff79,in_stack_ffffffffffffff78))) != 0) {
    __assert_fail("addr.ver == LRTR_IPV4",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x1c,"void test_v4(void)");
  }
  if (CONCAT13(aStack_84.addr4.addr._3_1_,
               CONCAT12(aStack_84.addr4.addr._2_1_,
                        CONCAT11(aStack_84.addr4.addr._1_1_,aStack_84.addr4.addr._0_1_))) != 0) {
    __assert_fail("addr.u.addr4.addr == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x1d,"void test_v4(void)");
  }
  lrtr_ip_addr_to_str((lrtr_ip_addr *)&stack0xffffffffffffff78,(char *)&local_58,0x10);
  if (CONCAT17(local_58.u.addr4.addr._3_1_,
               CONCAT16(local_58.u.addr4.addr._2_1_,
                        CONCAT15(local_58.u.addr4.addr._1_1_,
                                 CONCAT14(local_58.u.addr4.addr._0_1_,
                                          CONCAT13(local_58.ver._3_1_,
                                                   CONCAT12(local_58.ver._2_1_,
                                                            CONCAT11(local_58.ver._1_1_,
                                                                     (undefined1)local_58.ver)))))))
      != 0x302e302e302e30) {
    __assert_fail("strcmp(\"0.0.0.0\", buf) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x1f,"void test_v4(void)");
  }
  lrtr_ip_str_to_addr("255.255.255.255",(lrtr_ip_addr *)&stack0xffffffffffffff78);
  if (CONCAT13(in_stack_ffffffffffffff7b,
               CONCAT12(in_stack_ffffffffffffff7a,
                        CONCAT11(in_stack_ffffffffffffff79,in_stack_ffffffffffffff78))) != 0) {
    __assert_fail("addr.ver == LRTR_IPV4",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x22,"void test_v4(void)");
  }
  if (CONCAT13(aStack_84.addr4.addr._3_1_,
               CONCAT12(aStack_84.addr4.addr._2_1_,
                        CONCAT11(aStack_84.addr4.addr._1_1_,aStack_84.addr4.addr._0_1_))) != -1) {
    __assert_fail("addr.u.addr4.addr == 0xffffffff",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x23,"void test_v4(void)");
  }
  lrtr_ip_addr_to_str((lrtr_ip_addr *)&stack0xffffffffffffff78,(char *)&local_58,0x10);
  auVar3[0] = -((undefined1)local_58.ver == '2');
  auVar3[1] = -(local_58.ver._1_1_ == '5');
  auVar3[2] = -(local_58.ver._2_1_ == '5');
  auVar3[3] = -(local_58.ver._3_1_ == '.');
  auVar3[4] = -(local_58.u.addr4.addr._0_1_ == '2');
  auVar3[5] = -(local_58.u.addr4.addr._1_1_ == '5');
  auVar3[6] = -(local_58.u.addr4.addr._2_1_ == '5');
  auVar3[7] = -(local_58.u.addr4.addr._3_1_ == '.');
  auVar3[8] = -(local_58.u.addr6.addr[1]._0_1_ == '2');
  auVar3[9] = -(local_58.u.addr6.addr[1]._1_1_ == '5');
  auVar3[10] = -(local_58.u.addr6.addr[1]._2_1_ == '5');
  auVar3[0xb] = -(local_58.u.addr6.addr[1]._3_1_ == '.');
  auVar3[0xc] = -(local_58.u.addr6.addr[2]._0_1_ == '2');
  auVar3[0xd] = -(local_58.u.addr6.addr[2]._1_1_ == '5');
  auVar3[0xe] = -(local_58.u.addr6.addr[2]._2_1_ == '5');
  auVar3[0xf] = -(local_58.u.addr6.addr[2]._3_1_ == '\0');
  if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe | (ushort)(auVar3[0xf] >> 7) << 0xf) !=
      0xffff) {
    __assert_fail("strcmp(\"255.255.255.255\", buf) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x25,"void test_v4(void)");
  }
  lrtr_ip_str_to_addr("0.2.6.7",(lrtr_ip_addr *)&stack0xffffffffffffff78);
  if (CONCAT13(in_stack_ffffffffffffff7b,
               CONCAT12(in_stack_ffffffffffffff7a,
                        CONCAT11(in_stack_ffffffffffffff79,in_stack_ffffffffffffff78))) != 0) {
    __assert_fail("addr.ver == LRTR_IPV4",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x28,"void test_v4(void)");
  }
  if (CONCAT13(aStack_84.addr4.addr._3_1_,
               CONCAT12(aStack_84.addr4.addr._2_1_,
                        CONCAT11(aStack_84.addr4.addr._1_1_,aStack_84.addr4.addr._0_1_))) != 0x20607
     ) {
    __assert_fail("addr.u.addr4.addr == 0x20607",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x29,"void test_v4(void)");
  }
  lrtr_ip_addr_to_str((lrtr_ip_addr *)&stack0xffffffffffffff78,(char *)&local_58,0x10);
  if (CONCAT17(local_58.u.addr4.addr._3_1_,
               CONCAT16(local_58.u.addr4.addr._2_1_,
                        CONCAT15(local_58.u.addr4.addr._1_1_,
                                 CONCAT14(local_58.u.addr4.addr._0_1_,
                                          CONCAT13(local_58.ver._3_1_,
                                                   CONCAT12(local_58.ver._2_1_,
                                                            CONCAT11(local_58.ver._1_1_,
                                                                     (undefined1)local_58.ver)))))))
      != 0x372e362e322e30) {
    __assert_fail("strcmp(\"0.2.6.7\", buf) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x2b,"void test_v4(void)");
  }
  lrtr_ip_str_to_addr("78.69.255.0",(lrtr_ip_addr *)&stack0xffffffffffffff78);
  if (CONCAT13(in_stack_ffffffffffffff7b,
               CONCAT12(in_stack_ffffffffffffff7a,
                        CONCAT11(in_stack_ffffffffffffff79,in_stack_ffffffffffffff78))) != 0) {
    __assert_fail("addr.ver == LRTR_IPV4",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x2e,"void test_v4(void)");
  }
  if (CONCAT13(aStack_84.addr4.addr._3_1_,
               CONCAT12(aStack_84.addr4.addr._2_1_,
                        CONCAT11(aStack_84.addr4.addr._1_1_,aStack_84.addr4.addr._0_1_))) !=
      0x4e45ff00) {
    __assert_fail("addr.u.addr4.addr == 0x4e45ff00",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x2f,"void test_v4(void)");
  }
  lrtr_ip_addr_to_str((lrtr_ip_addr *)&stack0xffffffffffffff78,(char *)&local_58,0x10);
  if (CONCAT13(local_58.u.addr6.addr[1]._3_1_,
               CONCAT12(local_58.u.addr6.addr[1]._2_1_,
                        CONCAT11(local_58.u.addr6.addr[1]._1_1_,local_58.u.addr6.addr[1]._0_1_))) !=
      0x302e35 ||
      CONCAT17(local_58.u.addr4.addr._3_1_,
               CONCAT16(local_58.u.addr4.addr._2_1_,
                        CONCAT15(local_58.u.addr4.addr._1_1_,
                                 CONCAT14(local_58.u.addr4.addr._0_1_,
                                          CONCAT13(local_58.ver._3_1_,
                                                   CONCAT12(local_58.ver._2_1_,
                                                            CONCAT11(local_58.ver._1_1_,
                                                                     (undefined1)local_58.ver)))))))
      != 0x35322e39362e3837) {
    __assert_fail("strcmp(\"78.69.255.0\", buf) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x31,"void test_v4(void)");
  }
  lrtr_ip_str_to_addr("1.1.1.1",(lrtr_ip_addr *)&stack0xffffffffffffff78);
  if (CONCAT13(in_stack_ffffffffffffff7b,
               CONCAT12(in_stack_ffffffffffffff7a,
                        CONCAT11(in_stack_ffffffffffffff79,in_stack_ffffffffffffff78))) != 0) {
    __assert_fail("addr.ver == LRTR_IPV4",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x34,"void test_v4(void)");
  }
  if (CONCAT13(aStack_84.addr4.addr._3_1_,
               CONCAT12(aStack_84.addr4.addr._2_1_,
                        CONCAT11(aStack_84.addr4.addr._1_1_,aStack_84.addr4.addr._0_1_))) !=
      0x1010101) {
    __assert_fail("addr.u.addr4.addr == 0x1010101",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x35,"void test_v4(void)");
  }
  lrtr_ip_addr_to_str((lrtr_ip_addr *)&stack0xffffffffffffff78,(char *)&local_58,0x10);
  if (CONCAT17(local_58.u.addr4.addr._3_1_,
               CONCAT16(local_58.u.addr4.addr._2_1_,
                        CONCAT15(local_58.u.addr4.addr._1_1_,
                                 CONCAT14(local_58.u.addr4.addr._0_1_,
                                          CONCAT13(local_58.ver._3_1_,
                                                   CONCAT12(local_58.ver._2_1_,
                                                            CONCAT11(local_58.ver._1_1_,
                                                                     (undefined1)local_58.ver)))))))
      != 0x312e312e312e31) {
    __assert_fail("strcmp(\"1.1.1.1\", buf) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x37,"void test_v4(void)");
  }
  lrtr_ip_str_to_addr("5.0.255.255",(lrtr_ip_addr *)&stack0xffffffffffffff78);
  if (CONCAT13(in_stack_ffffffffffffff7b,
               CONCAT12(in_stack_ffffffffffffff7a,
                        CONCAT11(in_stack_ffffffffffffff79,in_stack_ffffffffffffff78))) != 0) {
    __assert_fail("addr.ver == LRTR_IPV4",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x3a,"void test_v4(void)");
  }
  if (CONCAT13(aStack_84.addr4.addr._3_1_,
               CONCAT12(aStack_84.addr4.addr._2_1_,
                        CONCAT11(aStack_84.addr4.addr._1_1_,aStack_84.addr4.addr._0_1_))) !=
      0x500ffff) {
    __assert_fail("addr.u.addr4.addr == 0x500ffff",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x3b,"void test_v4(void)");
  }
  lrtr_ip_addr_to_str((lrtr_ip_addr *)&stack0xffffffffffffff78,(char *)&local_58,0x10);
  if (CONCAT13(local_58.u.addr6.addr[1]._3_1_,
               CONCAT12(local_58.u.addr6.addr[1]._2_1_,
                        CONCAT11(local_58.u.addr6.addr[1]._1_1_,local_58.u.addr6.addr[1]._0_1_))) !=
      0x353532 ||
      CONCAT17(local_58.u.addr4.addr._3_1_,
               CONCAT16(local_58.u.addr4.addr._2_1_,
                        CONCAT15(local_58.u.addr4.addr._1_1_,
                                 CONCAT14(local_58.u.addr4.addr._0_1_,
                                          CONCAT13(local_58.ver._3_1_,
                                                   CONCAT12(local_58.ver._2_1_,
                                                            CONCAT11(local_58.ver._1_1_,
                                                                     (undefined1)local_58.ver)))))))
      != 0x2e3535322e302e35) {
    __assert_fail("strcmp(\"5.0.255.255\", buf) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x3d,"void test_v4(void)");
  }
  lrtr_ip_str_to_addr("8.9.6.3",(lrtr_ip_addr *)&stack0xffffffffffffff78);
  if (CONCAT13(in_stack_ffffffffffffff7b,
               CONCAT12(in_stack_ffffffffffffff7a,
                        CONCAT11(in_stack_ffffffffffffff79,in_stack_ffffffffffffff78))) != 0) {
    __assert_fail("addr.ver == LRTR_IPV4",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x40,"void test_v4(void)");
  }
  if (CONCAT13(aStack_84.addr4.addr._3_1_,
               CONCAT12(aStack_84.addr4.addr._2_1_,
                        CONCAT11(aStack_84.addr4.addr._1_1_,aStack_84.addr4.addr._0_1_))) !=
      0x8090603) {
    __assert_fail("addr.u.addr4.addr == 0x8090603",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x41,"void test_v4(void)");
  }
  lrtr_ip_addr_to_str((lrtr_ip_addr *)&stack0xffffffffffffff78,(char *)&local_58,0x10);
  if (CONCAT17(local_58.u.addr4.addr._3_1_,
               CONCAT16(local_58.u.addr4.addr._2_1_,
                        CONCAT15(local_58.u.addr4.addr._1_1_,
                                 CONCAT14(local_58.u.addr4.addr._0_1_,
                                          CONCAT13(local_58.ver._3_1_,
                                                   CONCAT12(local_58.ver._2_1_,
                                                            CONCAT11(local_58.ver._1_1_,
                                                                     (undefined1)local_58.ver)))))))
      != 0x332e362e392e38) {
    __assert_fail("strcmp(\"8.9.6.3\", buf) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x43,"void test_v4(void)");
  }
  iVar2 = lrtr_ip_str_to_addr("8,3,4,5",(lrtr_ip_addr *)&stack0xffffffffffffff78);
  if (iVar2 != -1) {
    __assert_fail("lrtr_ip_str_to_addr(\"8,3,4,5\", &addr) == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x46,"void test_v4(void)");
  }
  iVar2 = lrtr_ip_str_to_addr("8.4.5",(lrtr_ip_addr *)&stack0xffffffffffffff78);
  if (iVar2 != -1) {
    __assert_fail("lrtr_ip_str_to_addr(\"8.4.5\", &addr) == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x47,"void test_v4(void)");
  }
  lrtr_ip_str_to_addr("fdf8:f53b:82e4::53",&local_58);
  if (CONCAT13(local_58.u.addr4.addr._3_1_,
               CONCAT12(local_58.u.addr4.addr._2_1_,
                        CONCAT11(local_58.u.addr4.addr._1_1_,local_58.u.addr4.addr._0_1_))) !=
      -0x2070ac5) {
    __assert_fail("addr.u.addr6.addr[0] == 0xfdf8f53b",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x53,"void test_v6(void)");
  }
  if (CONCAT13(local_58.u.addr6.addr[1]._3_1_,
               CONCAT12(local_58.u.addr6.addr[1]._2_1_,
                        CONCAT11(local_58.u.addr6.addr[1]._1_1_,local_58.u.addr6.addr[1]._0_1_))) !=
      -0x7d1c0000) {
    __assert_fail("addr.u.addr6.addr[1] == 0x82e40000",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x54,"void test_v6(void)");
  }
  if (CONCAT13(local_58.u.addr6.addr[2]._3_1_,
               CONCAT12(local_58.u.addr6.addr[2]._2_1_,
                        CONCAT11(local_58.u.addr6.addr[2]._1_1_,local_58.u.addr6.addr[2]._0_1_))) !=
      0) {
    __assert_fail("addr.u.addr6.addr[2] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x55,"void test_v6(void)");
  }
  if (local_58.u.addr6.addr[3] != 0x53) {
    __assert_fail("addr.u.addr6.addr[3] == 0x53",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x56,"void test_v6(void)");
  }
  lrtr_ip_addr_to_str(&local_58,&stack0xffffffffffffff78,0x2e);
  auVar12[0] = -(in_stack_ffffffffffffff7b == '8');
  auVar12[1] = -(aStack_84.addr4.addr._0_1_ == ':');
  auVar12[2] = -(aStack_84.addr4.addr._1_1_ == 'f');
  auVar12[3] = -(aStack_84.addr4.addr._2_1_ == '5');
  auVar12[4] = -(aStack_84.addr4.addr._3_1_ == '3');
  auVar12[5] = -(aStack_84.addr6.addr[1]._0_1_ == 'b');
  auVar12[6] = -(aStack_84.addr6.addr[1]._1_1_ == ':');
  auVar12[7] = -(aStack_84.addr6.addr[1]._2_1_ == '8');
  auVar12[8] = -(aStack_84.addr6.addr[1]._3_1_ == '2');
  auVar12[9] = -(aStack_84.addr6.addr[2]._0_1_ == 'e');
  auVar12[10] = -(aStack_84.addr6.addr[2]._1_1_ == '4');
  auVar12[0xb] = -(aStack_84.addr6.addr[2]._2_1_ == ':');
  auVar12[0xc] = -(aStack_84.addr6.addr[2]._3_1_ == ':');
  auVar12[0xd] = -(aStack_84.addr6.addr[3]._0_1_ == '5');
  auVar12[0xe] = -(aStack_84.addr6.addr[3]._1_1_ == '3');
  auVar12[0xf] = -(aStack_84.addr6.addr[3]._2_1_ == '\0');
  auVar4[0] = -(in_stack_ffffffffffffff78 == 0x66);
  auVar4[1] = -(in_stack_ffffffffffffff79 == 100);
  auVar4[2] = -(in_stack_ffffffffffffff7a == 0x66);
  auVar4[3] = -(in_stack_ffffffffffffff7b == 0x38);
  auVar4[4] = -(aStack_84.addr4.addr._0_1_ == ':');
  auVar4[5] = -(aStack_84.addr4.addr._1_1_ == 'f');
  auVar4[6] = -(aStack_84.addr4.addr._2_1_ == '5');
  auVar4[7] = -(aStack_84.addr4.addr._3_1_ == '3');
  auVar4[8] = -(aStack_84.addr6.addr[1]._0_1_ == 'b');
  auVar4[9] = -(aStack_84.addr6.addr[1]._1_1_ == ':');
  auVar4[10] = -(aStack_84.addr6.addr[1]._2_1_ == '8');
  auVar4[0xb] = -(aStack_84.addr6.addr[1]._3_1_ == '2');
  auVar4[0xc] = -(aStack_84.addr6.addr[2]._0_1_ == 'e');
  auVar4[0xd] = -(aStack_84.addr6.addr[2]._1_1_ == '4');
  auVar4[0xe] = -(aStack_84.addr6.addr[2]._2_1_ == ':');
  auVar4[0xf] = -(aStack_84.addr6.addr[2]._3_1_ == ':');
  auVar4 = auVar4 & auVar12;
  if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) != 0xffff) {
    __assert_fail("strcmp(\"fdf8:f53b:82e4::53\", buf) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x58,"void test_v6(void)");
  }
  lrtr_ip_str_to_addr("fe80::200:5aee:feaa:20a2",&local_58);
  if (CONCAT13(local_58.u.addr4.addr._3_1_,
               CONCAT12(local_58.u.addr4.addr._2_1_,
                        CONCAT11(local_58.u.addr4.addr._1_1_,local_58.u.addr4.addr._0_1_))) !=
      -0x1800000) {
    __assert_fail("addr.u.addr6.addr[0] == 0xfe800000",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x5b,"void test_v6(void)");
  }
  if (CONCAT13(local_58.u.addr6.addr[1]._3_1_,
               CONCAT12(local_58.u.addr6.addr[1]._2_1_,
                        CONCAT11(local_58.u.addr6.addr[1]._1_1_,local_58.u.addr6.addr[1]._0_1_))) !=
      0) {
    __assert_fail("addr.u.addr6.addr[1] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x5c,"void test_v6(void)");
  }
  if (CONCAT13(local_58.u.addr6.addr[2]._3_1_,
               CONCAT12(local_58.u.addr6.addr[2]._2_1_,
                        CONCAT11(local_58.u.addr6.addr[2]._1_1_,local_58.u.addr6.addr[2]._0_1_))) !=
      0x2005aee) {
    __assert_fail("addr.u.addr6.addr[2] == 0x2005aee",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x5d,"void test_v6(void)");
  }
  if (local_58.u.addr6.addr[3] != 0xfeaa20a2) {
    __assert_fail("addr.u.addr6.addr[3] == 0xfeaa20a2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x5e,"void test_v6(void)");
  }
  lrtr_ip_addr_to_str(&local_58,&stack0xffffffffffffff78,0x2e);
  auVar13[0] = -(aStack_84.addr6.addr[1]._1_1_ == ':');
  auVar13[1] = -(aStack_84.addr6.addr[1]._2_1_ == '5');
  auVar13[2] = -(aStack_84.addr6.addr[1]._3_1_ == 'a');
  auVar13[3] = -(aStack_84.addr6.addr[2]._0_1_ == 'e');
  auVar13[4] = -(aStack_84.addr6.addr[2]._1_1_ == 'e');
  auVar13[5] = -(aStack_84.addr6.addr[2]._2_1_ == ':');
  auVar13[6] = -(aStack_84.addr6.addr[2]._3_1_ == 'f');
  auVar13[7] = -(aStack_84.addr6.addr[3]._0_1_ == 'e');
  auVar13[8] = -(aStack_84.addr6.addr[3]._1_1_ == 'a');
  auVar13[9] = -(aStack_84.addr6.addr[3]._2_1_ == 'a');
  auVar13[10] = -(aStack_84.addr6.addr[3]._3_1_ == ':');
  auVar13[0xb] = -(cStack_74 == '2');
  auVar13[0xc] = -(cStack_73 == '0');
  auVar13[0xd] = -(cStack_72 == 'a');
  auVar13[0xe] = -(cStack_71 == '2');
  auVar13[0xf] = -(cStack_70 == '\0');
  auVar5[0] = -(in_stack_ffffffffffffff78 == 0x66);
  auVar5[1] = -(in_stack_ffffffffffffff79 == 0x65);
  auVar5[2] = -(in_stack_ffffffffffffff7a == 0x38);
  auVar5[3] = -(in_stack_ffffffffffffff7b == 0x30);
  auVar5[4] = -(aStack_84.addr4.addr._0_1_ == ':');
  auVar5[5] = -(aStack_84.addr4.addr._1_1_ == ':');
  auVar5[6] = -(aStack_84.addr4.addr._2_1_ == '2');
  auVar5[7] = -(aStack_84.addr4.addr._3_1_ == '0');
  auVar5[8] = -(aStack_84.addr6.addr[1]._0_1_ == '0');
  auVar5[9] = -(aStack_84.addr6.addr[1]._1_1_ == ':');
  auVar5[10] = -(aStack_84.addr6.addr[1]._2_1_ == '5');
  auVar5[0xb] = -(aStack_84.addr6.addr[1]._3_1_ == 'a');
  auVar5[0xc] = -(aStack_84.addr6.addr[2]._0_1_ == 'e');
  auVar5[0xd] = -(aStack_84.addr6.addr[2]._1_1_ == 'e');
  auVar5[0xe] = -(aStack_84.addr6.addr[2]._2_1_ == ':');
  auVar5[0xf] = -(aStack_84.addr6.addr[2]._3_1_ == 'f');
  auVar5 = auVar5 & auVar13;
  if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) != 0xffff) {
    __assert_fail("strcmp(\"fe80::200:5aee:feaa:20a2\", buf) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x60,"void test_v6(void)");
  }
  lrtr_ip_str_to_addr("2001::1",&local_58);
  if (CONCAT13(local_58.u.addr4.addr._3_1_,
               CONCAT12(local_58.u.addr4.addr._2_1_,
                        CONCAT11(local_58.u.addr4.addr._1_1_,local_58.u.addr4.addr._0_1_))) !=
      0x20010000) {
    __assert_fail("addr.u.addr6.addr[0] == 0x20010000",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,99,"void test_v6(void)");
  }
  if (CONCAT13(local_58.u.addr6.addr[1]._3_1_,
               CONCAT12(local_58.u.addr6.addr[1]._2_1_,
                        CONCAT11(local_58.u.addr6.addr[1]._1_1_,local_58.u.addr6.addr[1]._0_1_))) !=
      0) {
    __assert_fail("addr.u.addr6.addr[1] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,100,"void test_v6(void)");
  }
  if (CONCAT13(local_58.u.addr6.addr[2]._3_1_,
               CONCAT12(local_58.u.addr6.addr[2]._2_1_,
                        CONCAT11(local_58.u.addr6.addr[2]._1_1_,local_58.u.addr6.addr[2]._0_1_))) !=
      0) {
    __assert_fail("addr.u.addr6.addr[2] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x65,"void test_v6(void)");
  }
  if (local_58.u.addr6.addr[3] != 1) {
    __assert_fail("addr.u.addr6.addr[3] == 0x1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x66,"void test_v6(void)");
  }
  lrtr_ip_addr_to_str(&local_58,&stack0xffffffffffffff78,0x2e);
  if (CONCAT17(aStack_84.addr4.addr._3_1_,
               CONCAT16(aStack_84.addr4.addr._2_1_,
                        CONCAT15(aStack_84.addr4.addr._1_1_,
                                 CONCAT14(aStack_84.addr4.addr._0_1_,
                                          CONCAT13(in_stack_ffffffffffffff7b,
                                                   CONCAT12(in_stack_ffffffffffffff7a,
                                                            CONCAT11(in_stack_ffffffffffffff79,
                                                                     in_stack_ffffffffffffff78))))))
              ) != 0x313a3a31303032) {
    __assert_fail("strcmp(\"2001::1\", buf) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x68,"void test_v6(void)");
  }
  lrtr_ip_str_to_addr("2001:0:4136:e378:8000:63bf:3fff:fdd2",&local_58);
  if (CONCAT13(local_58.u.addr4.addr._3_1_,
               CONCAT12(local_58.u.addr4.addr._2_1_,
                        CONCAT11(local_58.u.addr4.addr._1_1_,local_58.u.addr4.addr._0_1_))) !=
      0x20010000) {
    __assert_fail("addr.u.addr6.addr[0] == 0x20010000",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x6b,"void test_v6(void)");
  }
  if (CONCAT13(local_58.u.addr6.addr[1]._3_1_,
               CONCAT12(local_58.u.addr6.addr[1]._2_1_,
                        CONCAT11(local_58.u.addr6.addr[1]._1_1_,local_58.u.addr6.addr[1]._0_1_))) !=
      0x4136e378) {
    __assert_fail("addr.u.addr6.addr[1] == 0x4136e378",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x6c,"void test_v6(void)");
  }
  if (CONCAT13(local_58.u.addr6.addr[2]._3_1_,
               CONCAT12(local_58.u.addr6.addr[2]._2_1_,
                        CONCAT11(local_58.u.addr6.addr[2]._1_1_,local_58.u.addr6.addr[2]._0_1_))) !=
      -0x7fff9c41) {
    __assert_fail("addr.u.addr6.addr[2] == 0x800063bf",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x6d,"void test_v6(void)");
  }
  if (local_58.u.addr6.addr[3] != 0x3ffffdd2) {
    __assert_fail("addr.u.addr6.addr[3] == 0x3ffffdd2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x6e,"void test_v6(void)");
  }
  lrtr_ip_addr_to_str(&local_58,&stack0xffffffffffffff78,0x2e);
  iVar2 = bcmp("2001:0:4136:e378:8000:63bf:3fff:fdd2",&stack0xffffffffffffff78,0x25);
  if (iVar2 != 0) {
    __assert_fail("strcmp(\"2001:0:4136:e378:8000:63bf:3fff:fdd2\", buf) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x70,"void test_v6(void)");
  }
  lrtr_ip_str_to_addr("2001:2:6c::430",&local_58);
  if (CONCAT13(local_58.u.addr4.addr._3_1_,
               CONCAT12(local_58.u.addr4.addr._2_1_,
                        CONCAT11(local_58.u.addr4.addr._1_1_,local_58.u.addr4.addr._0_1_))) !=
      0x20010002) {
    __assert_fail("addr.u.addr6.addr[0] == 0x20010002",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x73,"void test_v6(void)");
  }
  if (CONCAT13(local_58.u.addr6.addr[1]._3_1_,
               CONCAT12(local_58.u.addr6.addr[1]._2_1_,
                        CONCAT11(local_58.u.addr6.addr[1]._1_1_,local_58.u.addr6.addr[1]._0_1_))) !=
      0x6c0000) {
    __assert_fail("addr.u.addr6.addr[1] == 0x6C0000",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x74,"void test_v6(void)");
  }
  if (CONCAT13(local_58.u.addr6.addr[2]._3_1_,
               CONCAT12(local_58.u.addr6.addr[2]._2_1_,
                        CONCAT11(local_58.u.addr6.addr[2]._1_1_,local_58.u.addr6.addr[2]._0_1_))) !=
      0) {
    __assert_fail("addr.u.addr6.addr[2] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x75,"void test_v6(void)");
  }
  if (local_58.u.addr6.addr[3] != 0x430) {
    __assert_fail("addr.u.addr6.addr[3] == 0x430",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x76,"void test_v6(void)");
  }
  lrtr_ip_addr_to_str(&local_58,&stack0xffffffffffffff78,0x2e);
  if (CONCAT17(aStack_84.addr6.addr[2]._2_1_,
               CONCAT16(aStack_84.addr6.addr[2]._1_1_,
                        CONCAT15(aStack_84.addr6.addr[2]._0_1_,
                                 CONCAT14(aStack_84.addr6.addr[1]._3_1_,
                                          CONCAT13(aStack_84.addr6.addr[1]._2_1_,
                                                   CONCAT12(aStack_84.addr6.addr[1]._1_1_,
                                                            CONCAT11(aStack_84.addr6.addr[1]._0_1_,
                                                                     aStack_84.addr4.addr._3_1_)))))
                       )) != 0x3033343a3a6336 ||
      CONCAT17(aStack_84.addr4.addr._3_1_,
               CONCAT16(aStack_84.addr4.addr._2_1_,
                        CONCAT15(aStack_84.addr4.addr._1_1_,
                                 CONCAT14(aStack_84.addr4.addr._0_1_,
                                          CONCAT13(in_stack_ffffffffffffff7b,
                                                   CONCAT12(in_stack_ffffffffffffff7a,
                                                            CONCAT11(in_stack_ffffffffffffff79,
                                                                     in_stack_ffffffffffffff78))))))
              ) != 0x363a323a31303032) {
    __assert_fail("strcmp(\"2001:2:6c::430\", buf) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x78,"void test_v6(void)");
  }
  lrtr_ip_str_to_addr("2001:10:240:ab::a",&local_58);
  if (CONCAT13(local_58.u.addr4.addr._3_1_,
               CONCAT12(local_58.u.addr4.addr._2_1_,
                        CONCAT11(local_58.u.addr4.addr._1_1_,local_58.u.addr4.addr._0_1_))) !=
      0x20010010) {
    __assert_fail("addr.u.addr6.addr[0] == 0x20010010",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x7b,"void test_v6(void)");
  }
  if (CONCAT13(local_58.u.addr6.addr[1]._3_1_,
               CONCAT12(local_58.u.addr6.addr[1]._2_1_,
                        CONCAT11(local_58.u.addr6.addr[1]._1_1_,local_58.u.addr6.addr[1]._0_1_))) !=
      0x24000ab) {
    __assert_fail("addr.u.addr6.addr[1] == 0x24000AB",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x7c,"void test_v6(void)");
  }
  if (CONCAT13(local_58.u.addr6.addr[2]._3_1_,
               CONCAT12(local_58.u.addr6.addr[2]._2_1_,
                        CONCAT11(local_58.u.addr6.addr[2]._1_1_,local_58.u.addr6.addr[2]._0_1_))) !=
      0) {
    __assert_fail("addr.u.addr6.addr[2] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x7d,"void test_v6(void)");
  }
  if (local_58.u.addr6.addr[3] != 10) {
    __assert_fail("addr.u.addr6.addr[3] == 0xa",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x7e,"void test_v6(void)");
  }
  lrtr_ip_addr_to_str(&local_58,&stack0xffffffffffffff78,0x2e);
  auVar6[0] = -(in_stack_ffffffffffffff78 == 0x32);
  auVar6[1] = -(in_stack_ffffffffffffff79 == 0x30);
  auVar6[2] = -(in_stack_ffffffffffffff7a == 0x30);
  auVar6[3] = -(in_stack_ffffffffffffff7b == 0x31);
  auVar6[4] = -(aStack_84.addr4.addr._0_1_ == ':');
  auVar6[5] = -(aStack_84.addr4.addr._1_1_ == '1');
  auVar6[6] = -(aStack_84.addr4.addr._2_1_ == '0');
  auVar6[7] = -(aStack_84.addr4.addr._3_1_ == ':');
  auVar6[8] = -(aStack_84.addr6.addr[1]._0_1_ == '2');
  auVar6[9] = -(aStack_84.addr6.addr[1]._1_1_ == '4');
  auVar6[10] = -(aStack_84.addr6.addr[1]._2_1_ == '0');
  auVar6[0xb] = -(aStack_84.addr6.addr[1]._3_1_ == ':');
  auVar6[0xc] = -(aStack_84.addr6.addr[2]._0_1_ == 'a');
  auVar6[0xd] = -(aStack_84.addr6.addr[2]._1_1_ == 'b');
  auVar6[0xe] = -(aStack_84.addr6.addr[2]._2_1_ == ':');
  auVar6[0xf] = -(aStack_84.addr6.addr[2]._3_1_ == ':');
  auVar14[0] = -(aStack_84.addr6.addr[3]._0_1_ == 'a');
  auVar14[1] = -(aStack_84.addr6.addr[3]._1_1_ == '\0');
  auVar14[2] = 0xff;
  auVar14[3] = 0xff;
  auVar14[4] = 0xff;
  auVar14[5] = 0xff;
  auVar14[6] = 0xff;
  auVar14[7] = 0xff;
  auVar14[8] = 0xff;
  auVar14[9] = 0xff;
  auVar14[10] = 0xff;
  auVar14[0xb] = 0xff;
  auVar14[0xc] = 0xff;
  auVar14[0xd] = 0xff;
  auVar14[0xe] = 0xff;
  auVar14[0xf] = 0xff;
  auVar14 = auVar14 & auVar6;
  if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) != 0xffff) {
    __assert_fail("strcmp(\"2001:10:240:ab::a\", buf) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x80,"void test_v6(void)");
  }
  lrtr_ip_str_to_addr("2002:cb0a:3cdd:1::1",&local_58);
  if (CONCAT13(local_58.u.addr4.addr._3_1_,
               CONCAT12(local_58.u.addr4.addr._2_1_,
                        CONCAT11(local_58.u.addr4.addr._1_1_,local_58.u.addr4.addr._0_1_))) !=
      0x2002cb0a) {
    __assert_fail("addr.u.addr6.addr[0] == 0x2002cb0a",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x83,"void test_v6(void)");
  }
  if (CONCAT13(local_58.u.addr6.addr[1]._3_1_,
               CONCAT12(local_58.u.addr6.addr[1]._2_1_,
                        CONCAT11(local_58.u.addr6.addr[1]._1_1_,local_58.u.addr6.addr[1]._0_1_))) !=
      0x3cdd0001) {
    __assert_fail("addr.u.addr6.addr[1] == 0x3cdd0001",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x84,"void test_v6(void)");
  }
  if (CONCAT13(local_58.u.addr6.addr[2]._3_1_,
               CONCAT12(local_58.u.addr6.addr[2]._2_1_,
                        CONCAT11(local_58.u.addr6.addr[2]._1_1_,local_58.u.addr6.addr[2]._0_1_))) !=
      0) {
    __assert_fail("addr.u.addr6.addr[2] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x85,"void test_v6(void)");
  }
  if (local_58.u.addr6.addr[3] != 1) {
    __assert_fail("addr.u.addr6.addr[3] == 0x1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x86,"void test_v6(void)");
  }
  lrtr_ip_addr_to_str(&local_58,&stack0xffffffffffffff78,0x2e);
  auVar15[0] = -(aStack_84.addr6.addr[3]._0_1_ == ':');
  auVar15[1] = -(aStack_84.addr6.addr[3]._1_1_ == ':');
  auVar15[2] = -(aStack_84.addr6.addr[3]._2_1_ == '1');
  auVar15[3] = -(aStack_84.addr6.addr[3]._3_1_ == '\0');
  auVar15[4] = 0xff;
  auVar15[5] = 0xff;
  auVar15[6] = 0xff;
  auVar15[7] = 0xff;
  auVar15[8] = 0xff;
  auVar15[9] = 0xff;
  auVar15[10] = 0xff;
  auVar15[0xb] = 0xff;
  auVar15[0xc] = 0xff;
  auVar15[0xd] = 0xff;
  auVar15[0xe] = 0xff;
  auVar15[0xf] = 0xff;
  auVar7[0] = -(in_stack_ffffffffffffff78 == 0x32);
  auVar7[1] = -(in_stack_ffffffffffffff79 == 0x30);
  auVar7[2] = -(in_stack_ffffffffffffff7a == 0x30);
  auVar7[3] = -(in_stack_ffffffffffffff7b == 0x32);
  auVar7[4] = -(aStack_84.addr4.addr._0_1_ == ':');
  auVar7[5] = -(aStack_84.addr4.addr._1_1_ == 'c');
  auVar7[6] = -(aStack_84.addr4.addr._2_1_ == 'b');
  auVar7[7] = -(aStack_84.addr4.addr._3_1_ == '0');
  auVar7[8] = -(aStack_84.addr6.addr[1]._0_1_ == 'a');
  auVar7[9] = -(aStack_84.addr6.addr[1]._1_1_ == ':');
  auVar7[10] = -(aStack_84.addr6.addr[1]._2_1_ == '3');
  auVar7[0xb] = -(aStack_84.addr6.addr[1]._3_1_ == 'c');
  auVar7[0xc] = -(aStack_84.addr6.addr[2]._0_1_ == 'd');
  auVar7[0xd] = -(aStack_84.addr6.addr[2]._1_1_ == 'd');
  auVar7[0xe] = -(aStack_84.addr6.addr[2]._2_1_ == ':');
  auVar7[0xf] = -(aStack_84.addr6.addr[2]._3_1_ == '1');
  auVar7 = auVar7 & auVar15;
  if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) != 0xffff) {
    __assert_fail("strcmp(\"2002:cb0a:3cdd:1::1\", buf) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x88,"void test_v6(void)");
  }
  lrtr_ip_str_to_addr("2001:db8:8:4::2",&local_58);
  if (CONCAT13(local_58.u.addr4.addr._3_1_,
               CONCAT12(local_58.u.addr4.addr._2_1_,
                        CONCAT11(local_58.u.addr4.addr._1_1_,local_58.u.addr4.addr._0_1_))) !=
      0x20010db8) {
    __assert_fail("addr.u.addr6.addr[0] == 0x20010db8",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x8b,"void test_v6(void)");
  }
  if (CONCAT13(local_58.u.addr6.addr[1]._3_1_,
               CONCAT12(local_58.u.addr6.addr[1]._2_1_,
                        CONCAT11(local_58.u.addr6.addr[1]._1_1_,local_58.u.addr6.addr[1]._0_1_))) !=
      0x80004) {
    __assert_fail("addr.u.addr6.addr[1] == 0x80004",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x8c,"void test_v6(void)");
  }
  if (CONCAT13(local_58.u.addr6.addr[2]._3_1_,
               CONCAT12(local_58.u.addr6.addr[2]._2_1_,
                        CONCAT11(local_58.u.addr6.addr[2]._1_1_,local_58.u.addr6.addr[2]._0_1_))) !=
      0) {
    __assert_fail("addr.u.addr6.addr[2] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x8d,"void test_v6(void)");
  }
  if (local_58.u.addr6.addr[3] != 2) {
    __assert_fail("addr.u.addr6.addr[3] == 0x2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x8e,"void test_v6(void)");
  }
  lrtr_ip_addr_to_str(&local_58,&stack0xffffffffffffff78,0x2e);
  auVar8[0] = -(in_stack_ffffffffffffff78 == '2');
  auVar8[1] = -(in_stack_ffffffffffffff79 == '0');
  auVar8[2] = -(in_stack_ffffffffffffff7a == '0');
  auVar8[3] = -(in_stack_ffffffffffffff7b == '1');
  auVar8[4] = -(aStack_84.addr4.addr._0_1_ == ':');
  auVar8[5] = -(aStack_84.addr4.addr._1_1_ == 'd');
  auVar8[6] = -(aStack_84.addr4.addr._2_1_ == 'b');
  auVar8[7] = -(aStack_84.addr4.addr._3_1_ == '8');
  auVar8[8] = -(aStack_84.addr6.addr[1]._0_1_ == ':');
  auVar8[9] = -(aStack_84.addr6.addr[1]._1_1_ == '8');
  auVar8[10] = -(aStack_84.addr6.addr[1]._2_1_ == ':');
  auVar8[0xb] = -(aStack_84.addr6.addr[1]._3_1_ == '4');
  auVar8[0xc] = -(aStack_84.addr6.addr[2]._0_1_ == ':');
  auVar8[0xd] = -(aStack_84.addr6.addr[2]._1_1_ == ':');
  auVar8[0xe] = -(aStack_84.addr6.addr[2]._2_1_ == '2');
  auVar8[0xf] = -(aStack_84.addr6.addr[2]._3_1_ == '\0');
  if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe | (ushort)(auVar8[0xf] >> 7) << 0xf) !=
      0xffff) {
    __assert_fail("strcmp(\"2001:db8:8:4::2\", buf) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0x90,"void test_v6(void)");
  }
  lrtr_ip_str_to_addr("FF01:0:0:0:0:0:0:2",&local_58);
  if (CONCAT13(local_58.u.addr4.addr._3_1_,
               CONCAT12(local_58.u.addr4.addr._2_1_,
                        CONCAT11(local_58.u.addr4.addr._1_1_,local_58.u.addr4.addr._0_1_))) ==
      -0xff0000) {
    if (CONCAT13(local_58.u.addr6.addr[1]._3_1_,
                 CONCAT12(local_58.u.addr6.addr[1]._2_1_,
                          CONCAT11(local_58.u.addr6.addr[1]._1_1_,local_58.u.addr6.addr[1]._0_1_)))
        != 0) {
      __assert_fail("addr.u.addr6.addr[1] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                    ,0x94,"void test_v6(void)");
    }
    if (CONCAT13(local_58.u.addr6.addr[2]._3_1_,
                 CONCAT12(local_58.u.addr6.addr[2]._2_1_,
                          CONCAT11(local_58.u.addr6.addr[2]._1_1_,local_58.u.addr6.addr[2]._0_1_)))
        != 0) {
      __assert_fail("addr.u.addr6.addr[2] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                    ,0x95,"void test_v6(void)");
    }
    if (local_58.u.addr6.addr[3] != 2) {
      __assert_fail("addr.u.addr6.addr[3] == 0x2",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                    ,0x96,"void test_v6(void)");
    }
    lrtr_ip_addr_to_str(&local_58,&stack0xffffffffffffff78,0x2e);
    if (CONCAT17(aStack_84.addr4.addr._3_1_,
                 CONCAT16(aStack_84.addr4.addr._2_1_,
                          CONCAT15(aStack_84.addr4.addr._1_1_,
                                   CONCAT14(aStack_84.addr4.addr._0_1_,
                                            CONCAT13(in_stack_ffffffffffffff7b,
                                                     CONCAT12(in_stack_ffffffffffffff7a,
                                                              CONCAT11(in_stack_ffffffffffffff79,
                                                                       in_stack_ffffffffffffff78))))
                                  ))) != 0x323a3a31306666) {
      __assert_fail("strcmp(\"ff01::2\", buf) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                    ,0x98,"void test_v6(void)");
    }
    lrtr_ip_str_to_addr("fdf8:f53b:82e4::53",&local_58);
    if (CONCAT13(local_58.u.addr4.addr._3_1_,
                 CONCAT12(local_58.u.addr4.addr._2_1_,
                          CONCAT11(local_58.u.addr4.addr._1_1_,local_58.u.addr4.addr._0_1_))) !=
        -0x2070ac5) {
      __assert_fail("addr.u.addr6.addr[0] == 0xfdf8f53b",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                    ,0x9b,"void test_v6(void)");
    }
    if (CONCAT13(local_58.u.addr6.addr[1]._3_1_,
                 CONCAT12(local_58.u.addr6.addr[1]._2_1_,
                          CONCAT11(local_58.u.addr6.addr[1]._1_1_,local_58.u.addr6.addr[1]._0_1_)))
        != -0x7d1c0000) {
      __assert_fail("addr.u.addr6.addr[1] == 0x82e40000",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                    ,0x9c,"void test_v6(void)");
    }
    if (CONCAT13(local_58.u.addr6.addr[2]._3_1_,
                 CONCAT12(local_58.u.addr6.addr[2]._2_1_,
                          CONCAT11(local_58.u.addr6.addr[2]._1_1_,local_58.u.addr6.addr[2]._0_1_)))
        != 0) {
      __assert_fail("addr.u.addr6.addr[2] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                    ,0x9d,"void test_v6(void)");
    }
    if (local_58.u.addr6.addr[3] != 0x53) {
      __assert_fail("addr.u.addr6.addr[3] == 0x53",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                    ,0x9e,"void test_v6(void)");
    }
    lrtr_ip_addr_to_str(&local_58,&stack0xffffffffffffff78,0x2e);
    auVar9[0] = -(in_stack_ffffffffffffff78 == 0x66);
    auVar9[1] = -(in_stack_ffffffffffffff79 == 100);
    auVar9[2] = -(in_stack_ffffffffffffff7a == 0x66);
    auVar9[3] = -(in_stack_ffffffffffffff7b == 0x38);
    auVar9[4] = -(aStack_84.addr4.addr._0_1_ == ':');
    auVar9[5] = -(aStack_84.addr4.addr._1_1_ == 'f');
    auVar9[6] = -(aStack_84.addr4.addr._2_1_ == '5');
    auVar9[7] = -(aStack_84.addr4.addr._3_1_ == '3');
    auVar9[8] = -(aStack_84.addr6.addr[1]._0_1_ == 'b');
    auVar9[9] = -(aStack_84.addr6.addr[1]._1_1_ == ':');
    auVar9[10] = -(aStack_84.addr6.addr[1]._2_1_ == '8');
    auVar9[0xb] = -(aStack_84.addr6.addr[1]._3_1_ == '2');
    auVar9[0xc] = -(aStack_84.addr6.addr[2]._0_1_ == 'e');
    auVar9[0xd] = -(aStack_84.addr6.addr[2]._1_1_ == '4');
    auVar9[0xe] = -(aStack_84.addr6.addr[2]._2_1_ == ':');
    auVar9[0xf] = -(aStack_84.addr6.addr[2]._3_1_ == ':');
    auVar17[0] = -(in_stack_ffffffffffffff7b == 0x38);
    auVar17[1] = -(aStack_84.addr4.addr._0_1_ == ':');
    auVar17[2] = -(aStack_84.addr4.addr._1_1_ == 'f');
    auVar17[3] = -(aStack_84.addr4.addr._2_1_ == '5');
    auVar17[4] = -(aStack_84.addr4.addr._3_1_ == '3');
    auVar17[5] = -(aStack_84.addr6.addr[1]._0_1_ == 'b');
    auVar17[6] = -(aStack_84.addr6.addr[1]._1_1_ == ':');
    auVar17[7] = -(aStack_84.addr6.addr[1]._2_1_ == '8');
    auVar17[8] = -(aStack_84.addr6.addr[1]._3_1_ == '2');
    auVar17[9] = -(aStack_84.addr6.addr[2]._0_1_ == 'e');
    auVar17[10] = -(aStack_84.addr6.addr[2]._1_1_ == '4');
    auVar17[0xb] = -(aStack_84.addr6.addr[2]._2_1_ == ':');
    auVar17[0xc] = -(aStack_84.addr6.addr[2]._3_1_ == ':');
    auVar17[0xd] = -(aStack_84.addr6.addr[3]._0_1_ == '5');
    auVar17[0xe] = -(aStack_84.addr6.addr[3]._1_1_ == '3');
    auVar17[0xf] = -(aStack_84.addr6.addr[3]._2_1_ == '\0');
    auVar9 = auVar9 & auVar17;
    if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) != 0xffff) {
      __assert_fail("strcmp(\"fdf8:f53b:82e4::53\", buf) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                    ,0xa0,"void test_v6(void)");
    }
    lrtr_ip_str_to_addr("fe80::200:5aee:feaa:20a2",&local_58);
    if (CONCAT13(local_58.u.addr4.addr._3_1_,
                 CONCAT12(local_58.u.addr4.addr._2_1_,
                          CONCAT11(local_58.u.addr4.addr._1_1_,local_58.u.addr4.addr._0_1_))) !=
        -0x1800000) {
      __assert_fail("addr.u.addr6.addr[0] == 0xfe800000",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                    ,0xa3,"void test_v6(void)");
    }
    if (CONCAT13(local_58.u.addr6.addr[1]._3_1_,
                 CONCAT12(local_58.u.addr6.addr[1]._2_1_,
                          CONCAT11(local_58.u.addr6.addr[1]._1_1_,local_58.u.addr6.addr[1]._0_1_)))
        != 0) {
      __assert_fail("addr.u.addr6.addr[1] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                    ,0xa4,"void test_v6(void)");
    }
    if (CONCAT13(local_58.u.addr6.addr[2]._3_1_,
                 CONCAT12(local_58.u.addr6.addr[2]._2_1_,
                          CONCAT11(local_58.u.addr6.addr[2]._1_1_,local_58.u.addr6.addr[2]._0_1_)))
        != 0x2005aee) {
      __assert_fail("addr.u.addr6.addr[2] == 0x2005aee",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                    ,0xa5,"void test_v6(void)");
    }
    if (local_58.u.addr6.addr[3] != 0xfeaa20a2) {
      __assert_fail("addr.u.addr6.addr[3] == 0xfeaa20a2",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                    ,0xa6,"void test_v6(void)");
    }
    lrtr_ip_addr_to_str(&local_58,&stack0xffffffffffffff78,0x2e);
    auVar10[0] = -(in_stack_ffffffffffffff78 == 0x66);
    auVar10[1] = -(in_stack_ffffffffffffff79 == 0x65);
    auVar10[2] = -(in_stack_ffffffffffffff7a == 0x38);
    auVar10[3] = -(in_stack_ffffffffffffff7b == 0x30);
    auVar10[4] = -(aStack_84.addr4.addr._0_1_ == ':');
    auVar10[5] = -(aStack_84.addr4.addr._1_1_ == ':');
    auVar10[6] = -(aStack_84.addr4.addr._2_1_ == '2');
    auVar10[7] = -(aStack_84.addr4.addr._3_1_ == '0');
    auVar10[8] = -(aStack_84.addr6.addr[1]._0_1_ == '0');
    auVar10[9] = -(aStack_84.addr6.addr[1]._1_1_ == ':');
    auVar10[10] = -(aStack_84.addr6.addr[1]._2_1_ == '5');
    auVar10[0xb] = -(aStack_84.addr6.addr[1]._3_1_ == 'a');
    auVar10[0xc] = -(aStack_84.addr6.addr[2]._0_1_ == 'e');
    auVar10[0xd] = -(aStack_84.addr6.addr[2]._1_1_ == 'e');
    auVar10[0xe] = -(aStack_84.addr6.addr[2]._2_1_ == ':');
    auVar10[0xf] = -(aStack_84.addr6.addr[2]._3_1_ == 'f');
    auVar18[0] = -(aStack_84.addr6.addr[1]._1_1_ == ':');
    auVar18[1] = -(aStack_84.addr6.addr[1]._2_1_ == '5');
    auVar18[2] = -(aStack_84.addr6.addr[1]._3_1_ == 'a');
    auVar18[3] = -(aStack_84.addr6.addr[2]._0_1_ == 'e');
    auVar18[4] = -(aStack_84.addr6.addr[2]._1_1_ == 'e');
    auVar18[5] = -(aStack_84.addr6.addr[2]._2_1_ == ':');
    auVar18[6] = -(aStack_84.addr6.addr[2]._3_1_ == 'f');
    auVar18[7] = -(aStack_84.addr6.addr[3]._0_1_ == 'e');
    auVar18[8] = -(aStack_84.addr6.addr[3]._1_1_ == 'a');
    auVar18[9] = -(aStack_84.addr6.addr[3]._2_1_ == 'a');
    auVar18[10] = -(aStack_84.addr6.addr[3]._3_1_ == ':');
    auVar18[0xb] = -(cStack_74 == '2');
    auVar18[0xc] = -(cStack_73 == '0');
    auVar18[0xd] = -(cStack_72 == 'a');
    auVar18[0xe] = -(cStack_71 == '2');
    auVar18[0xf] = -(cStack_70 == '\0');
    auVar10 = auVar10 & auVar18;
    if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) != 0xffff) {
      __assert_fail("strcmp(\"fe80::200:5aee:feaa:20a2\", buf) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                    ,0xa8,"void test_v6(void)");
    }
    lrtr_ip_str_to_addr("2001::1",&local_58);
    if (CONCAT13(local_58.u.addr4.addr._3_1_,
                 CONCAT12(local_58.u.addr4.addr._2_1_,
                          CONCAT11(local_58.u.addr4.addr._1_1_,local_58.u.addr4.addr._0_1_))) !=
        0x20010000) {
      __assert_fail("addr.u.addr6.addr[0] == 0x20010000",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                    ,0xab,"void test_v6(void)");
    }
    if (CONCAT13(local_58.u.addr6.addr[1]._3_1_,
                 CONCAT12(local_58.u.addr6.addr[1]._2_1_,
                          CONCAT11(local_58.u.addr6.addr[1]._1_1_,local_58.u.addr6.addr[1]._0_1_)))
        != 0) {
      __assert_fail("addr.u.addr6.addr[1] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                    ,0xac,"void test_v6(void)");
    }
    if (CONCAT13(local_58.u.addr6.addr[2]._3_1_,
                 CONCAT12(local_58.u.addr6.addr[2]._2_1_,
                          CONCAT11(local_58.u.addr6.addr[2]._1_1_,local_58.u.addr6.addr[2]._0_1_)))
        != 0) {
      __assert_fail("addr.u.addr6.addr[2] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                    ,0xad,"void test_v6(void)");
    }
    if (local_58.u.addr6.addr[3] != 1) {
      __assert_fail("addr.u.addr6.addr[3] == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                    ,0xae,"void test_v6(void)");
    }
    lrtr_ip_addr_to_str(&local_58,&stack0xffffffffffffff78,0x2e);
    if (CONCAT17(aStack_84.addr4.addr._3_1_,
                 CONCAT16(aStack_84.addr4.addr._2_1_,
                          CONCAT15(aStack_84.addr4.addr._1_1_,
                                   CONCAT14(aStack_84.addr4.addr._0_1_,
                                            CONCAT13(in_stack_ffffffffffffff7b,
                                                     CONCAT12(in_stack_ffffffffffffff7a,
                                                              CONCAT11(in_stack_ffffffffffffff79,
                                                                       in_stack_ffffffffffffff78))))
                                  ))) != 0x313a3a31303032) {
      __assert_fail("strcmp(\"2001::1\", buf) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                    ,0xb0,"void test_v6(void)");
    }
    lrtr_ip_str_to_addr("2001:0:4136:e378:8000:63bf:3fff:fdd2",&local_58);
    if (CONCAT13(local_58.u.addr4.addr._3_1_,
                 CONCAT12(local_58.u.addr4.addr._2_1_,
                          CONCAT11(local_58.u.addr4.addr._1_1_,local_58.u.addr4.addr._0_1_))) !=
        0x20010000) {
      __assert_fail("addr.u.addr6.addr[0] == 0x20010000",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                    ,0xb3,"void test_v6(void)");
    }
    if (CONCAT13(local_58.u.addr6.addr[1]._3_1_,
                 CONCAT12(local_58.u.addr6.addr[1]._2_1_,
                          CONCAT11(local_58.u.addr6.addr[1]._1_1_,local_58.u.addr6.addr[1]._0_1_)))
        != 0x4136e378) {
      __assert_fail("addr.u.addr6.addr[1] == 0x4136e378",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                    ,0xb4,"void test_v6(void)");
    }
    if (CONCAT13(local_58.u.addr6.addr[2]._3_1_,
                 CONCAT12(local_58.u.addr6.addr[2]._2_1_,
                          CONCAT11(local_58.u.addr6.addr[2]._1_1_,local_58.u.addr6.addr[2]._0_1_)))
        != -0x7fff9c41) {
      __assert_fail("addr.u.addr6.addr[2] == 0x800063bf",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                    ,0xb5,"void test_v6(void)");
    }
    if (local_58.u.addr6.addr[3] != 0x3ffffdd2) {
      __assert_fail("addr.u.addr6.addr[3] == 0x3ffffdd2",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                    ,0xb6,"void test_v6(void)");
    }
    lrtr_ip_addr_to_str(&local_58,&stack0xffffffffffffff78,0x2e);
    iVar2 = bcmp("2001:0:4136:e378:8000:63bf:3fff:fdd2",&stack0xffffffffffffff78,0x25);
    if (iVar2 != 0) {
      __assert_fail("strcmp(\"2001:0:4136:e378:8000:63bf:3fff:fdd2\", buf) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                    ,0xb8,"void test_v6(void)");
    }
    lrtr_ip_str_to_addr("::ffff:192.0.2.128",&local_58);
    if (CONCAT13(local_58.u.addr4.addr._3_1_,
                 CONCAT12(local_58.u.addr4.addr._2_1_,
                          CONCAT11(local_58.u.addr4.addr._1_1_,local_58.u.addr4.addr._0_1_))) != 0)
    {
      __assert_fail("addr.u.addr6.addr[0] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                    ,0xbc,"void test_v6(void)");
    }
    if (CONCAT13(local_58.u.addr6.addr[1]._3_1_,
                 CONCAT12(local_58.u.addr6.addr[1]._2_1_,
                          CONCAT11(local_58.u.addr6.addr[1]._1_1_,local_58.u.addr6.addr[1]._0_1_)))
        != 0) {
      __assert_fail("addr.u.addr6.addr[1] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                    ,0xbd,"void test_v6(void)");
    }
    if (CONCAT13(local_58.u.addr6.addr[2]._3_1_,
                 CONCAT12(local_58.u.addr6.addr[2]._2_1_,
                          CONCAT11(local_58.u.addr6.addr[2]._1_1_,local_58.u.addr6.addr[2]._0_1_)))
        != 0xffff) {
      __assert_fail("addr.u.addr6.addr[2] == 0xffff",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                    ,0xbe,"void test_v6(void)");
    }
    if (local_58.u.addr6.addr[3] != 0xc0000280) {
      __assert_fail("addr.u.addr6.addr[3] == 0xc0000280",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                    ,0xbf,"void test_v6(void)");
    }
    lrtr_ip_addr_to_str(&local_58,&stack0xffffffffffffff78,0x2e);
    auVar16[0] = -(in_stack_ffffffffffffff7b == 'f');
    auVar16[1] = -(aStack_84.addr4.addr._0_1_ == 'f');
    auVar16[2] = -(aStack_84.addr4.addr._1_1_ == 'f');
    auVar16[3] = -(aStack_84.addr4.addr._2_1_ == ':');
    auVar16[4] = -(aStack_84.addr4.addr._3_1_ == '1');
    auVar16[5] = -(aStack_84.addr6.addr[1]._0_1_ == '9');
    auVar16[6] = -(aStack_84.addr6.addr[1]._1_1_ == '2');
    auVar16[7] = -(aStack_84.addr6.addr[1]._2_1_ == '.');
    auVar16[8] = -(aStack_84.addr6.addr[1]._3_1_ == '0');
    auVar16[9] = -(aStack_84.addr6.addr[2]._0_1_ == '.');
    auVar16[10] = -(aStack_84.addr6.addr[2]._1_1_ == '2');
    auVar16[0xb] = -(aStack_84.addr6.addr[2]._2_1_ == '.');
    auVar16[0xc] = -(aStack_84.addr6.addr[2]._3_1_ == '1');
    auVar16[0xd] = -(aStack_84.addr6.addr[3]._0_1_ == '2');
    auVar16[0xe] = -(aStack_84.addr6.addr[3]._1_1_ == '8');
    auVar16[0xf] = -(aStack_84.addr6.addr[3]._2_1_ == '\0');
    auVar11[0] = -(in_stack_ffffffffffffff78 == 0x3a);
    auVar11[1] = -(in_stack_ffffffffffffff79 == 0x3a);
    auVar11[2] = -(in_stack_ffffffffffffff7a == 0x66);
    auVar11[3] = -(in_stack_ffffffffffffff7b == 0x66);
    auVar11[4] = -(aStack_84.addr4.addr._0_1_ == 'f');
    auVar11[5] = -(aStack_84.addr4.addr._1_1_ == 'f');
    auVar11[6] = -(aStack_84.addr4.addr._2_1_ == ':');
    auVar11[7] = -(aStack_84.addr4.addr._3_1_ == '1');
    auVar11[8] = -(aStack_84.addr6.addr[1]._0_1_ == '9');
    auVar11[9] = -(aStack_84.addr6.addr[1]._1_1_ == '2');
    auVar11[10] = -(aStack_84.addr6.addr[1]._2_1_ == '.');
    auVar11[0xb] = -(aStack_84.addr6.addr[1]._3_1_ == '0');
    auVar11[0xc] = -(aStack_84.addr6.addr[2]._0_1_ == '.');
    auVar11[0xd] = -(aStack_84.addr6.addr[2]._1_1_ == '2');
    auVar11[0xe] = -(aStack_84.addr6.addr[2]._2_1_ == '.');
    auVar11[0xf] = -(aStack_84.addr6.addr[2]._3_1_ == '1');
    auVar11 = auVar11 & auVar16;
    if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) != 0xffff) {
      __assert_fail("strcmp(\"::ffff:192.0.2.128\", buf) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                    ,0xc1,"void test_v6(void)");
    }
    lrtr_ip_str_to_addr("::10.58.64.34",&local_58);
    if (CONCAT13(local_58.u.addr4.addr._3_1_,
                 CONCAT12(local_58.u.addr4.addr._2_1_,
                          CONCAT11(local_58.u.addr4.addr._1_1_,local_58.u.addr4.addr._0_1_))) != 0)
    {
      __assert_fail("addr.u.addr6.addr[0] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                    ,0xc4,"void test_v6(void)");
    }
    if (CONCAT13(local_58.u.addr6.addr[1]._3_1_,
                 CONCAT12(local_58.u.addr6.addr[1]._2_1_,
                          CONCAT11(local_58.u.addr6.addr[1]._1_1_,local_58.u.addr6.addr[1]._0_1_)))
        != 0) {
      __assert_fail("addr.u.addr6.addr[1] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                    ,0xc5,"void test_v6(void)");
    }
    if (CONCAT13(local_58.u.addr6.addr[2]._3_1_,
                 CONCAT12(local_58.u.addr6.addr[2]._2_1_,
                          CONCAT11(local_58.u.addr6.addr[2]._1_1_,local_58.u.addr6.addr[2]._0_1_)))
        == 0) {
      if (local_58.u.addr6.addr[3] != 0xa3a4022) {
        __assert_fail("addr.u.addr6.addr[3] == 0xa3a4022",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                      ,199,"void test_v6(void)");
      }
      lrtr_ip_addr_to_str(&local_58,&stack0xffffffffffffff78,0x2e);
      if (CONCAT17(aStack_84.addr6.addr[2]._1_1_,
                   CONCAT16(aStack_84.addr6.addr[2]._0_1_,
                            CONCAT15(aStack_84.addr6.addr[1]._3_1_,
                                     CONCAT14(aStack_84.addr6.addr[1]._2_1_,
                                              CONCAT13(aStack_84.addr6.addr[1]._1_1_,
                                                       CONCAT12(aStack_84.addr6.addr[1]._0_1_,
                                                                CONCAT11(aStack_84.addr4.addr._3_1_,
                                                                         aStack_84.addr4.addr._2_1_)
                                                               )))))) != 0x34332e34362e38 ||
          CONCAT17(aStack_84.addr4.addr._3_1_,
                   CONCAT16(aStack_84.addr4.addr._2_1_,
                            CONCAT15(aStack_84.addr4.addr._1_1_,
                                     CONCAT14(aStack_84.addr4.addr._0_1_,
                                              CONCAT13(in_stack_ffffffffffffff7b,
                                                       CONCAT12(in_stack_ffffffffffffff7a,
                                                                CONCAT11(in_stack_ffffffffffffff79,
                                                                         in_stack_ffffffffffffff78))
                                                      ))))) != 0x2e38352e30313a3a) {
        __assert_fail("strcmp(\"::10.58.64.34\", buf) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                      ,0xc9,"void test_v6(void)");
      }
      iVar2 = lrtr_ip_str_to_addr("::ffff:192.0,2.128",&local_58);
      if (iVar2 != -1) {
        __assert_fail("lrtr_ip_str_to_addr(\"::ffff:192.0,2.128\", &addr) == -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                      ,0xcc,"void test_v6(void)");
      }
      iVar2 = lrtr_ip_addr_to_str(&local_58,&stack0xffffffffffffff78,10);
      if (iVar2 != -1) {
        __assert_fail("lrtr_ip_addr_to_str(&addr, buf, 10) == -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                      ,0xcf,"void test_v6(void)");
      }
      iVar2 = lrtr_ip_str_to_addr(":ffff::ffff",&local_58);
      if (iVar2 != -1) {
        __assert_fail("lrtr_ip_str_to_addr(\":ffff::ffff\", &addr) == -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                      ,0xd2,"void test_v6(void)");
      }
      iVar2 = lrtr_ip_str_to_addr("::ffff::ffff",&local_58);
      if (iVar2 != -1) {
        __assert_fail("lrtr_ip_str_to_addr(\"::ffff::ffff\", &addr) == -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                      ,0xd5,"void test_v6(void)");
      }
      iVar2 = lrtr_ip_str_to_addr("2001:0:6:8:0:f:3fff:fdd2:55",&local_58);
      if (iVar2 != -1) {
        __assert_fail("lrtr_ip_str_to_addr(\"2001:0:6:8:0:f:3fff:fdd2:55\", &addr) == -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                      ,0xd8,"void test_v6(void)");
      }
      iVar2 = lrtr_ip_str_to_addr("::fffff",&local_58);
      if (iVar2 == -1) {
        iVar2 = lrtr_ip_str_to_addr("2001:",&local_58);
        if (iVar2 != -1) {
          __assert_fail("lrtr_ip_str_to_addr(\"2001:\\0::\", &addr) == -1",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                        ,0xde,"void test_v6(void)");
        }
        lrtr_ip_str_to_addr("2001:0:4136:e378:8000:63bf:3fff:fdd2",
                            (lrtr_ip_addr *)&stack0xffffffffffffff78);
        lrtr_ip_str_to_addr("2001:0:4136:e378:8000:63bf:3fff:fdd2",&local_58);
        a.u.addr6.addr[3]._1_1_ = local_58.ver._1_1_;
        a.u.addr6.addr[3]._0_1_ = (undefined1)local_58.ver;
        a.u.addr6.addr[3]._2_1_ = local_58.ver._2_1_;
        a.u.addr6.addr[3]._3_1_ = local_58.ver._3_1_;
        b.ver._1_1_ = local_58.u.addr6.addr[1]._1_1_;
        b.ver._0_1_ = local_58.u.addr6.addr[1]._0_1_;
        b.ver._2_1_ = local_58.u.addr6.addr[1]._2_1_;
        b.ver._3_1_ = local_58.u.addr6.addr[1]._3_1_;
        b.u.addr4.addr._0_1_ = local_58.u.addr6.addr[2]._0_1_;
        b.u.addr4.addr._1_1_ = local_58.u.addr6.addr[2]._1_1_;
        b.u.addr4.addr._2_1_ = local_58.u.addr6.addr[2]._2_1_;
        b.u.addr4.addr._3_1_ = local_58.u.addr6.addr[2]._3_1_;
        a.ver._1_1_ = aStack_84.addr6.addr[1]._1_1_;
        a.ver._0_1_ = aStack_84.addr6.addr[1]._0_1_;
        a.ver._2_1_ = aStack_84.addr6.addr[1]._2_1_;
        a.ver._3_1_ = aStack_84.addr6.addr[1]._3_1_;
        a.u.addr4.addr._0_1_ = aStack_84.addr6.addr[2]._0_1_;
        a.u.addr4.addr._1_1_ = aStack_84.addr6.addr[2]._1_1_;
        a.u.addr4.addr._2_1_ = aStack_84.addr6.addr[2]._2_1_;
        a.u.addr4.addr._3_1_ = aStack_84.addr6.addr[2]._3_1_;
        a.u.addr6.addr[1] = aStack_84.addr6.addr[3];
        a.u.addr6.addr[2] = in_stack_ffffffffffffff5c;
        b.u.addr6.addr[1] = local_58.u.addr6.addr[3];
        b.u.addr6.addr[2] = in_stack_ffffffffffffff74;
        b.u.addr6.addr[3]._0_1_ = in_stack_ffffffffffffff78;
        b.u.addr6.addr[3]._1_1_ = in_stack_ffffffffffffff79;
        b.u.addr6.addr[3]._2_1_ = in_stack_ffffffffffffff7a;
        b.u.addr6.addr[3]._3_1_ = in_stack_ffffffffffffff7b;
        _Var1 = lrtr_ip_addr_equal(a,b);
        if (!_Var1) {
          __assert_fail("lrtr_ip_addr_equal(addr1, addr2) == true",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                        ,0xeb,"void test_cmp(void)");
        }
        lrtr_ip_str_to_addr("2001:0:4136:e378:8000:63bf:3fff:fdd3",&local_58);
        a_00.u.addr6.addr[3]._1_1_ = local_58.ver._1_1_;
        a_00.u.addr6.addr[3]._0_1_ = (undefined1)local_58.ver;
        a_00.u.addr6.addr[3]._2_1_ = local_58.ver._2_1_;
        a_00.u.addr6.addr[3]._3_1_ = local_58.ver._3_1_;
        b_00.ver._1_1_ = local_58.u.addr6.addr[1]._1_1_;
        b_00.ver._0_1_ = local_58.u.addr6.addr[1]._0_1_;
        b_00.ver._2_1_ = local_58.u.addr6.addr[1]._2_1_;
        b_00.ver._3_1_ = local_58.u.addr6.addr[1]._3_1_;
        b_00.u.addr4.addr._0_1_ = local_58.u.addr6.addr[2]._0_1_;
        b_00.u.addr4.addr._1_1_ = local_58.u.addr6.addr[2]._1_1_;
        b_00.u.addr4.addr._2_1_ = local_58.u.addr6.addr[2]._2_1_;
        b_00.u.addr4.addr._3_1_ = local_58.u.addr6.addr[2]._3_1_;
        a_00.ver._1_1_ = aStack_84.addr6.addr[1]._1_1_;
        a_00.ver._0_1_ = aStack_84.addr6.addr[1]._0_1_;
        a_00.ver._2_1_ = aStack_84.addr6.addr[1]._2_1_;
        a_00.ver._3_1_ = aStack_84.addr6.addr[1]._3_1_;
        a_00.u.addr4.addr._0_1_ = aStack_84.addr6.addr[2]._0_1_;
        a_00.u.addr4.addr._1_1_ = aStack_84.addr6.addr[2]._1_1_;
        a_00.u.addr4.addr._2_1_ = aStack_84.addr6.addr[2]._2_1_;
        a_00.u.addr4.addr._3_1_ = aStack_84.addr6.addr[2]._3_1_;
        a_00.u.addr6.addr[1] = aStack_84.addr6.addr[3];
        a_00.u.addr6.addr[2] = in_stack_ffffffffffffff5c;
        b_00.u.addr6.addr[1] = local_58.u.addr6.addr[3];
        b_00.u.addr6.addr[2] = in_stack_ffffffffffffff74;
        b_00.u.addr6.addr[3]._0_1_ = in_stack_ffffffffffffff78;
        b_00.u.addr6.addr[3]._1_1_ = in_stack_ffffffffffffff79;
        b_00.u.addr6.addr[3]._2_1_ = in_stack_ffffffffffffff7a;
        b_00.u.addr6.addr[3]._3_1_ = in_stack_ffffffffffffff7b;
        _Var1 = lrtr_ip_addr_equal(a_00,b_00);
        if (_Var1) {
          __assert_fail("lrtr_ip_addr_equal(addr1, addr2) == false",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                        ,0xee,"void test_cmp(void)");
        }
        lrtr_ip_str_to_addr("141.22.5.22",&local_58);
        a_01.u.addr6.addr[3]._1_1_ = local_58.ver._1_1_;
        a_01.u.addr6.addr[3]._0_1_ = (undefined1)local_58.ver;
        a_01.u.addr6.addr[3]._2_1_ = local_58.ver._2_1_;
        a_01.u.addr6.addr[3]._3_1_ = local_58.ver._3_1_;
        b_01.ver._1_1_ = local_58.u.addr6.addr[1]._1_1_;
        b_01.ver._0_1_ = local_58.u.addr6.addr[1]._0_1_;
        b_01.ver._2_1_ = local_58.u.addr6.addr[1]._2_1_;
        b_01.ver._3_1_ = local_58.u.addr6.addr[1]._3_1_;
        b_01.u.addr4.addr._0_1_ = local_58.u.addr6.addr[2]._0_1_;
        b_01.u.addr4.addr._1_1_ = local_58.u.addr6.addr[2]._1_1_;
        b_01.u.addr4.addr._2_1_ = local_58.u.addr6.addr[2]._2_1_;
        b_01.u.addr4.addr._3_1_ = local_58.u.addr6.addr[2]._3_1_;
        a_01.ver._1_1_ = aStack_84.addr6.addr[1]._1_1_;
        a_01.ver._0_1_ = aStack_84.addr6.addr[1]._0_1_;
        a_01.ver._2_1_ = aStack_84.addr6.addr[1]._2_1_;
        a_01.ver._3_1_ = aStack_84.addr6.addr[1]._3_1_;
        a_01.u.addr4.addr._0_1_ = aStack_84.addr6.addr[2]._0_1_;
        a_01.u.addr4.addr._1_1_ = aStack_84.addr6.addr[2]._1_1_;
        a_01.u.addr4.addr._2_1_ = aStack_84.addr6.addr[2]._2_1_;
        a_01.u.addr4.addr._3_1_ = aStack_84.addr6.addr[2]._3_1_;
        a_01.u.addr6.addr[1] = aStack_84.addr6.addr[3];
        a_01.u.addr6.addr[2] = in_stack_ffffffffffffff5c;
        b_01.u.addr6.addr[1] = local_58.u.addr6.addr[3];
        b_01.u.addr6.addr[2] = in_stack_ffffffffffffff74;
        b_01.u.addr6.addr[3]._0_1_ = in_stack_ffffffffffffff78;
        b_01.u.addr6.addr[3]._1_1_ = in_stack_ffffffffffffff79;
        b_01.u.addr6.addr[3]._2_1_ = in_stack_ffffffffffffff7a;
        b_01.u.addr6.addr[3]._3_1_ = in_stack_ffffffffffffff7b;
        _Var1 = lrtr_ip_addr_equal(a_01,b_01);
        if (!_Var1) {
          lrtr_ip_str_to_addr("141.22.5.22",(lrtr_ip_addr *)&stack0xffffffffffffff78);
          a_02.u.addr6.addr[3]._1_1_ = local_58.ver._1_1_;
          a_02.u.addr6.addr[3]._0_1_ = (undefined1)local_58.ver;
          a_02.u.addr6.addr[3]._2_1_ = local_58.ver._2_1_;
          a_02.u.addr6.addr[3]._3_1_ = local_58.ver._3_1_;
          b_02.ver._1_1_ = local_58.u.addr6.addr[1]._1_1_;
          b_02.ver._0_1_ = local_58.u.addr6.addr[1]._0_1_;
          b_02.ver._2_1_ = local_58.u.addr6.addr[1]._2_1_;
          b_02.ver._3_1_ = local_58.u.addr6.addr[1]._3_1_;
          b_02.u.addr4.addr._0_1_ = local_58.u.addr6.addr[2]._0_1_;
          b_02.u.addr4.addr._1_1_ = local_58.u.addr6.addr[2]._1_1_;
          b_02.u.addr4.addr._2_1_ = local_58.u.addr6.addr[2]._2_1_;
          b_02.u.addr4.addr._3_1_ = local_58.u.addr6.addr[2]._3_1_;
          a_02.ver._1_1_ = aStack_84.addr6.addr[1]._1_1_;
          a_02.ver._0_1_ = aStack_84.addr6.addr[1]._0_1_;
          a_02.ver._2_1_ = aStack_84.addr6.addr[1]._2_1_;
          a_02.ver._3_1_ = aStack_84.addr6.addr[1]._3_1_;
          a_02.u.addr4.addr._0_1_ = aStack_84.addr6.addr[2]._0_1_;
          a_02.u.addr4.addr._1_1_ = aStack_84.addr6.addr[2]._1_1_;
          a_02.u.addr4.addr._2_1_ = aStack_84.addr6.addr[2]._2_1_;
          a_02.u.addr4.addr._3_1_ = aStack_84.addr6.addr[2]._3_1_;
          a_02.u.addr6.addr[1] = aStack_84.addr6.addr[3];
          a_02.u.addr6.addr[2] = in_stack_ffffffffffffff5c;
          b_02.u.addr6.addr[1] = local_58.u.addr6.addr[3];
          b_02.u.addr6.addr[2] = in_stack_ffffffffffffff74;
          b_02.u.addr6.addr[3]._0_1_ = in_stack_ffffffffffffff78;
          b_02.u.addr6.addr[3]._1_1_ = in_stack_ffffffffffffff79;
          b_02.u.addr6.addr[3]._2_1_ = in_stack_ffffffffffffff7a;
          b_02.u.addr6.addr[3]._3_1_ = in_stack_ffffffffffffff7b;
          _Var1 = lrtr_ip_addr_equal(a_02,b_02);
          if (!_Var1) {
            __assert_fail("lrtr_ip_addr_equal(addr1, addr2) == true",
                          "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                          ,0xf4,"void test_cmp(void)");
          }
          lrtr_ip_str_to_addr("141.26.5.23",(lrtr_ip_addr *)&stack0xffffffffffffff78);
          puts("Test successful");
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            return 0;
          }
          __stack_chk_fail();
        }
        __assert_fail("lrtr_ip_addr_equal(addr1, addr2) == false",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                      ,0xf1,"void test_cmp(void)");
      }
      __assert_fail("lrtr_ip_str_to_addr(\"::fffff\", &addr) == -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                    ,0xdb,"void test_v6(void)");
    }
    __assert_fail("addr.u.addr6.addr[2] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                  ,0xc6,"void test_v6(void)");
  }
  __assert_fail("addr.u.addr6.addr[0] == 0xff010000",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                ,0x93,"void test_v6(void)");
}

Assistant:

int main(void)
{
	test_v4();
	test_v6();
	test_cmp();
	printf("Test successful\n");
	return EXIT_SUCCESS;
}